

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall OpenMD::VectorAccumulator::add(VectorAccumulator *this,ElementType *val)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  double *pdVar5;
  Vector<double,_3U> *in_RSI;
  long in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint i;
  RealType len;
  undefined8 local_a0;
  undefined8 local_98;
  undefined4 local_1c;
  undefined8 local_18;
  
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
  local_18 = 0.0;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    pdVar5 = Vector<double,_3U>::operator[](in_RSI,local_1c);
    dVar1 = *pdVar5;
    pdVar5 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0x28),local_1c);
    dVar2 = *pdVar5;
    uVar3 = *(undefined8 *)(in_RDI + 8);
    auVar6._8_4_ = (int)((ulong)uVar3 >> 0x20);
    auVar6._0_8_ = uVar3;
    auVar6._12_4_ = 0x45300000;
    pdVar5 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0x28),local_1c);
    *pdVar5 = *pdVar5 + (dVar1 - dVar2) /
                        ((auVar6._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
    pdVar5 = Vector<double,_3U>::operator[](in_RSI,local_1c);
    dVar1 = *pdVar5;
    pdVar5 = Vector<double,_3U>::operator[](in_RSI,local_1c);
    dVar2 = *pdVar5;
    pdVar5 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0x40),local_1c);
    dVar4 = *pdVar5;
    uVar3 = *(undefined8 *)(in_RDI + 8);
    auVar7._8_4_ = (int)((ulong)uVar3 >> 0x20);
    auVar7._0_8_ = uVar3;
    auVar7._12_4_ = 0x45300000;
    pdVar5 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0x40),local_1c);
    *pdVar5 = (dVar1 * dVar2 - dVar4) /
              ((auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) + *pdVar5;
    pdVar5 = Vector<double,_3U>::operator[](in_RSI,local_1c);
    dVar1 = *pdVar5;
    pdVar5 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0x10),local_1c);
    *pdVar5 = dVar1;
    pdVar5 = Vector<double,_3U>::operator[](in_RSI,local_1c);
    dVar1 = *pdVar5;
    pdVar5 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0x58),local_1c);
    *pdVar5 = dVar1 + *pdVar5;
    pdVar5 = Vector<double,_3U>::operator[](in_RSI,local_1c);
    dVar1 = *pdVar5;
    pdVar5 = Vector<double,_3U>::operator[](in_RSI,local_1c);
    local_18 = dVar1 * *pdVar5 + local_18;
  }
  local_a0 = sqrt(local_18);
  uVar3 = *(undefined8 *)(in_RDI + 8);
  auVar9._8_4_ = (int)((ulong)uVar3 >> 0x20);
  auVar9._0_8_ = uVar3;
  auVar9._12_4_ = 0x45300000;
  *(double *)(in_RDI + 0x70) =
       *(double *)(in_RDI + 0x70) +
       (local_a0 - *(double *)(in_RDI + 0x70)) /
       ((auVar9._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
  uVar3 = *(undefined8 *)(in_RDI + 8);
  auVar8._8_4_ = (int)((ulong)uVar3 >> 0x20);
  auVar8._0_8_ = uVar3;
  auVar8._12_4_ = 0x45300000;
  *(double *)(in_RDI + 0x78) =
       (local_a0 * local_a0 - *(double *)(in_RDI + 0x78)) /
       ((auVar8._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) + *(double *)(in_RDI + 0x78);
  if (*(ulong *)(in_RDI + 8) < 2) {
    *(double *)(in_RDI + 0x88) = local_a0;
    *(double *)(in_RDI + 0x80) = local_a0;
  }
  else {
    local_98 = local_a0;
    if (local_a0 < *(double *)(in_RDI + 0x88) || local_a0 == *(double *)(in_RDI + 0x88)) {
      local_98 = *(double *)(in_RDI + 0x88);
    }
    *(double *)(in_RDI + 0x88) = local_98;
    if (*(double *)(in_RDI + 0x80) <= local_a0) {
      local_a0 = *(double *)(in_RDI + 0x80);
    }
    *(double *)(in_RDI + 0x80) = local_a0;
  }
  return;
}

Assistant:

void add(ElementType const& val) {
      Count_++;
      RealType len(0.0);
      for (unsigned int i = 0; i < 3; i++) {
        Avg_[i] += (val[i] - Avg_[i]) / Count_;
        Avg2_[i] += (val[i] * val[i] - Avg2_[i]) / Count_;
        Val_[i] = val[i];
        Total_[i] += val[i];
        len += val[i] * val[i];
      }
      len = sqrt(len);
      AvgLen_ += (len - AvgLen_) / Count_;
      AvgLen2_ += (len * len - AvgLen2_) / Count_;

      if (Count_ <= 1) {
        Max_ = len;
        Min_ = len;
      } else {
        Max_ = len > Max_ ? len : Max_;
        Min_ = len < Min_ ? len : Min_;
      }
    }